

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O1

void __thiscall
DIS::EnvironmentalProcessPdu::marshal(EnvironmentalProcessPdu *this,DataStream *dataStream)

{
  pointer pEVar1;
  ulong uVar2;
  long lVar3;
  Environment x;
  Environment local_48;
  
  SyntheticEnvironmentFamilyPdu::marshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::marshal(&this->_environementalProcessID,dataStream);
  EntityType::marshal(&this->_environmentType,dataStream);
  DataStream::operator<<(dataStream,this->_modelType);
  DataStream::operator<<(dataStream,this->_environmentStatus);
  DataStream::operator<<
            (dataStream,
             (char)((uint)(*(int *)&(this->_environmentRecords).
                                    super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->_environmentRecords).
                                   super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55);
  DataStream::operator<<(dataStream,this->_sequenceNumber);
  pEVar1 = (this->_environmentRecords).
           super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_environmentRecords).
      super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar1) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      local_48._vptr_Environment = (_func_int **)&PTR__Environment_0019fed8;
      local_48._padding2 = *(uchar *)((long)&pEVar1->_environmentType + lVar3);
      local_48._8_8_ = *(undefined8 *)((long)&pEVar1->_vptr_Environment + lVar3);
      Environment::marshal(&local_48,dataStream);
      Environment::~Environment(&local_48);
      uVar2 = uVar2 + 1;
      pEVar1 = (this->_environmentRecords).
               super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (uVar2 < (ulong)(((long)(this->_environmentRecords).
                                    super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 3)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void EnvironmentalProcessPdu::marshal(DataStream& dataStream) const
{
    SyntheticEnvironmentFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _environementalProcessID.marshal(dataStream);
    _environmentType.marshal(dataStream);
    dataStream << _modelType;
    dataStream << _environmentStatus;
    dataStream << ( unsigned char )_environmentRecords.size();
    dataStream << _sequenceNumber;

     for(size_t idx = 0; idx < _environmentRecords.size(); idx++)
     {
        Environment x = _environmentRecords[idx];
        x.marshal(dataStream);
     }

}